

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O2

unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>,_true>
__thiscall
duckdb::StandardColumnWriter<int,_int,_duckdb::ParquetCastOperator>::InitializePageState
          (StandardColumnWriter<int,_int,_duckdb::ParquetCastOperator> *this,
          PrimitiveColumnWriterState *state_p,idx_t page_idx)

{
  reference pvVar1;
  size_type in_RCX;
  unsigned_long local_28;
  _func_int **local_20;
  
  pvVar1 = vector<duckdb::PageInformation,_true>::get<true>
                     ((vector<duckdb::PageInformation,_true> *)(page_idx + 0x88),in_RCX);
  local_28 = pvVar1->row_count - (pvVar1->empty_count + pvVar1->null_count);
  make_uniq<duckdb::StandardWriterPageState<int,int,duckdb::ParquetCastOperator>,unsigned_long,unsigned_long&,duckdb_parquet::Encoding::type&,duckdb::PrimitiveDictionary<int,int,duckdb::ParquetCastOperator>&>
            ((duckdb *)&local_20,&local_28,(unsigned_long *)(page_idx + 0xd8),
             (type *)(page_idx + 0x188),
             (PrimitiveDictionary<int,_int,_duckdb::ParquetCastOperator> *)(page_idx + 0xe8));
  (this->super_PrimitiveColumnWriter).super_ColumnWriter._vptr_ColumnWriter = local_20;
  return (unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>_>
          )(unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>_>
            )this;
}

Assistant:

unique_ptr<ColumnWriterPageState> InitializePageState(PrimitiveColumnWriterState &state_p,
	                                                      idx_t page_idx) override {
		auto &state = state_p.Cast<StandardColumnWriterState<SRC, TGT, OP>>();
		const auto &page_info = state_p.page_info[page_idx];
		auto result = make_uniq<StandardWriterPageState<SRC, TGT, OP>>(
		    page_info.row_count - (page_info.empty_count + page_info.null_count), state.total_string_size,
		    state.encoding, state.dictionary);
		return std::move(result);
	}